

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall CServer::GetClientInfo(CServer *this,int ClientID,CClientInfo *pInfo)

{
  int iVar1;
  long *in_RDX;
  int in_ESI;
  char *in_RDI;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint local_4;
  
  dbg_assert_imp(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(char *)0x10eaba);
  dbg_assert_imp(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(char *)0x10eae0);
  iVar1 = *(int *)(in_RDI + (long)in_ESI * 0x195f0 + 0x38);
  if (iVar1 == 5) {
    *in_RDX = (long)(in_RDI + (long)in_ESI * 0x195f0 + 0x19588);
    *(undefined4 *)(in_RDX + 1) = *(undefined4 *)(in_RDI + (long)in_ESI * 0x195f0 + 0x3c);
  }
  local_4 = (uint)(iVar1 == 5);
  return local_4;
}

Assistant:

int CServer::GetClientInfo(int ClientID, CClientInfo *pInfo) const
{
	dbg_assert(ClientID >= 0 && ClientID < MAX_CLIENTS, "client_id is not valid");
	dbg_assert(pInfo != 0, "info can not be null");

	if(m_aClients[ClientID].m_State == CClient::STATE_INGAME)
	{
		pInfo->m_pName = m_aClients[ClientID].m_aName;
		pInfo->m_Latency = m_aClients[ClientID].m_Latency;
		return 1;
	}
	return 0;
}